

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

ggml_tensor * __thiscall
llm_build_mamba::build_mamba_layer
          (llm_build_mamba *this,ggml_cgraph *gf,ggml_tensor *cur,ggml_tensor *state_copy,
          ggml_tensor *state_mask,llama_ubatch *ubatch,int il)

{
  float fVar1;
  bool bVar2;
  uint n_seqs;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  llama_hparams *this_00;
  llama_memory_i *plVar6;
  ggml_tensor *s;
  ggml_context *pgVar7;
  int64_t iVar8;
  int64_t iVar9;
  size_t sVar10;
  size_t sVar11;
  ggml_context *pgVar12;
  uint32_t uVar13;
  ulong uVar14;
  ggml_tensor *pgVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  long lVar19;
  undefined8 uVar20;
  long lVar21;
  ggml_tensor *pgVar22;
  ggml_tensor *cur_00;
  undefined8 uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  
  n_seqs = ubatch->n_seqs;
  uVar29 = (ulong)n_seqs;
  if (uVar29 == 0) {
    pcVar27 = "n_seqs != 0";
    uVar16 = 0x21e7;
  }
  else if (ubatch->equal_seqs == false) {
    pcVar27 = "ubatch.equal_seqs";
    uVar16 = 0x21e8;
  }
  else {
    uVar14 = (ulong)ubatch->n_seq_tokens;
    uVar3 = ubatch->n_tokens;
    if (uVar14 * uVar29 - (ulong)uVar3 == 0) {
      this_00 = (this->super_llm_graph_context).hparams;
      plVar6 = (this->super_llm_graph_context).memory;
      uVar4 = *(uint *)&plVar6[0xd]._vptr_llama_memory_i;
      uVar5 = this_00->ssm_d_conv;
      uVar24 = (ulong)this_00->ssm_d_inner;
      uVar25 = (ulong)this_00->ssm_d_state;
      uVar26 = (ulong)this_00->ssm_dt_rank;
      bVar2 = this_00->ssm_dt_b_c_rms;
      fVar1 = this_00->f_norm_rms_eps;
      lVar28 = (long)il;
      pgVar22 = (ggml_tensor *)plVar6[0x12]._vptr_llama_memory_i[lVar28];
      s = (ggml_tensor *)plVar6[0x15]._vptr_llama_memory_i[lVar28];
      uVar13 = llama_hparams::n_embd_k_s(this_00);
      pgVar15 = llm_graph_context::build_copy_mask_state
                          (&this->super_llm_graph_context,gf,pgVar22,state_copy,state_mask,uVar13,
                           n_seqs);
      lVar30 = (ulong)uVar5 - 1;
      uVar16 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar15,lVar30,uVar24,uVar29);
      uVar13 = llama_hparams::n_embd_v_s((this->super_llm_graph_context).hparams);
      pgVar15 = llm_graph_context::build_copy_mask_state
                          (&this->super_llm_graph_context,gf,s,state_copy,state_mask,uVar13,n_seqs);
      uVar17 = ggml_reshape_3d((this->super_llm_graph_context).ctx0,pgVar15,uVar25,uVar24,uVar29);
      pgVar15 = (ggml_tensor *)
                ggml_reshape_3d((this->super_llm_graph_context).ctx0,cur,cur->ne[0],uVar14,uVar29);
      pgVar15 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28].ssm_in,pgVar15);
      uVar18 = ggml_view_3d((this->super_llm_graph_context).ctx0,pgVar15,uVar24,pgVar15->ne[1],
                            pgVar15->ne[2],pgVar15->nb[1],pgVar15->nb[2],0);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      iVar8 = pgVar15->ne[1];
      iVar9 = pgVar15->ne[2];
      sVar10 = pgVar15->nb[1];
      sVar11 = pgVar15->nb[2];
      lVar19 = ggml_element_size(pgVar15);
      uVar20 = ggml_view_3d(pgVar7,pgVar15,uVar24,iVar8,iVar9,sVar10,sVar11,lVar19 * uVar24);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar18 = ggml_transpose(pgVar7,uVar18);
      lVar19 = ggml_concat(pgVar7,uVar16,uVar18,0);
      uVar16 = ggml_view_3d((this->super_llm_graph_context).ctx0,lVar19,lVar30,uVar24,uVar29,
                            *(undefined8 *)(lVar19 + 0x38),*(undefined8 *)(lVar19 + 0x40),
                            *(long *)(lVar19 + 0x30) * uVar14);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      lVar21 = ggml_element_size(pgVar22);
      uVar18 = ggml_view_1d(pgVar7,pgVar22,lVar30 * uVar24 * uVar29,
                            lVar30 * uVar24 * (ulong)uVar4 * lVar21);
      uVar16 = ggml_cpy(pgVar7,uVar16,uVar18);
      ggml_build_forward_expand(gf,uVar16);
      uVar16 = ggml_ssm_conv((this->super_llm_graph_context).ctx0,lVar19,
                             (this->model->layers).
                             super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar28].ssm_conv1d);
      uVar16 = ggml_add((this->super_llm_graph_context).ctx0,uVar16,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar28].ssm_conv1d_b);
      pgVar22 = (ggml_tensor *)ggml_silu((this->super_llm_graph_context).ctx0,uVar16);
      pgVar15 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28].ssm_x,pgVar22);
      cur_00 = (ggml_tensor *)
               ggml_view_3d((this->super_llm_graph_context).ctx0,pgVar15,uVar26,uVar14,uVar29,
                            pgVar15->nb[1],pgVar15->nb[2],0);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      sVar10 = pgVar15->nb[1];
      sVar11 = pgVar15->nb[2];
      lVar19 = ggml_element_size(pgVar15);
      uVar16 = ggml_view_3d(pgVar7,pgVar15,uVar25,uVar14,uVar29,sVar10,sVar11,lVar19 * uVar26);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      sVar10 = pgVar15->nb[1];
      sVar11 = pgVar15->nb[2];
      lVar19 = ggml_element_size(pgVar15);
      uVar18 = ggml_view_3d(pgVar7,pgVar15,uVar25,uVar14,uVar29,sVar10,sVar11,
                            (uVar26 + uVar25) * lVar19);
      if (bVar2 != false) {
        cur_00 = (ggml_tensor *)ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,cur_00);
        uVar16 = ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,uVar16);
        uVar18 = ggml_rms_norm(fVar1,(this->super_llm_graph_context).ctx0,uVar18);
      }
      pgVar15 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28].ssm_dt,cur_00);
      uVar23 = ggml_add((this->super_llm_graph_context).ctx0,pgVar15,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar28].ssm_dt_b);
      uVar16 = ggml_ssm_scan((this->super_llm_graph_context).ctx0,uVar17,pgVar22,uVar23,
                             (this->model->layers).
                             super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar28].ssm_a,uVar16,uVar18);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      lVar21 = uVar25 * uVar24 * uVar29;
      uVar17 = ggml_view_1d(pgVar7,uVar16,lVar21,pgVar22->nb[3]);
      pgVar12 = (this->super_llm_graph_context).ctx0;
      lVar19 = ggml_element_size(s);
      uVar18 = ggml_view_1d(pgVar12,s,lVar21,uVar4 * uVar24 * uVar25 * lVar19);
      uVar17 = ggml_cpy(pgVar7,uVar17,uVar18);
      ggml_build_forward_expand(gf,uVar17);
      uVar16 = ggml_view_3d((this->super_llm_graph_context).ctx0,uVar16,uVar24,uVar14,uVar29,
                            pgVar22->nb[1],pgVar22->nb[2],0);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar17 = ggml_mul(pgVar7,pgVar22,
                        (this->model->layers).
                        super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar28].ssm_d);
      uVar16 = ggml_add(pgVar7,uVar16,uVar17);
      pgVar7 = (this->super_llm_graph_context).ctx0;
      uVar17 = ggml_cont(pgVar7,uVar20);
      uVar17 = ggml_silu(pgVar7,uVar17);
      pgVar22 = (ggml_tensor *)ggml_mul(pgVar7,uVar16,uVar17);
      pgVar22 = llm_graph_context::build_lora_mm
                          (&this->super_llm_graph_context,
                           (this->model->layers).
                           super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar28].ssm_out,pgVar22);
      pgVar22 = (ggml_tensor *)
                ggml_reshape_2d((this->super_llm_graph_context).ctx0,pgVar22,pgVar22->ne[0],
                                (ulong)uVar3);
      return pgVar22;
    }
    pcVar27 = "ubatch.n_tokens == n_seq_tokens * n_seqs";
    uVar16 = 0x21e9;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,uVar16,"GGML_ASSERT(%s) failed",pcVar27);
}

Assistant:

ggml_tensor * build_mamba_layer(
             ggml_cgraph * gf,
             ggml_tensor * cur,
             ggml_tensor * state_copy,
             ggml_tensor * state_mask,
      const llama_ubatch & ubatch,
                     int   il) const {
        const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

        const auto kv_head = kv_self->head;

        const int64_t d_conv  = hparams.ssm_d_conv;
        const int64_t d_inner = hparams.ssm_d_inner;
        const int64_t d_state = hparams.ssm_d_state;
        const int64_t dt_rank = hparams.ssm_dt_rank;
        const int64_t n_seqs  = ubatch.n_seqs;
        // Some variants of Mamba arch (e.g. FalconMamba do apply layer norm on B and Dt layers)
        const bool ssm_dt_b_c_rms = hparams.ssm_dt_b_c_rms;
        // Use the same RMS norm as the final layer norm
        const float norm_rms_eps = hparams.f_norm_rms_eps;

        const int64_t n_seq_tokens = ubatch.n_seq_tokens;

        GGML_ASSERT(n_seqs != 0);
        GGML_ASSERT(ubatch.equal_seqs);
        GGML_ASSERT(ubatch.n_tokens == n_seq_tokens * n_seqs);

        ggml_tensor * conv_states_all = kv_self->k_l[il];
        ggml_tensor * ssm_states_all  = kv_self->v_l[il];

        // (ab)using the KV cache to store the states
        ggml_tensor * conv = build_copy_mask_state(
                gf, conv_states_all, state_copy, state_mask,
                hparams.n_embd_k_s(), n_seqs);
        conv = ggml_reshape_3d(ctx0, conv, d_conv - 1, d_inner, n_seqs);
        ggml_tensor * ssm = build_copy_mask_state(
                gf, ssm_states_all, state_copy, state_mask,
                hparams.n_embd_v_s(), n_seqs);
        ssm = ggml_reshape_3d(ctx0, ssm, d_state, d_inner, n_seqs);

        // {n_embd, n_tokens} => {n_embd, n_seq_tokens, n_seqs}
        cur = ggml_reshape_3d(ctx0, cur, cur->ne[0], n_seq_tokens, n_seqs);

        // {n_embd, 2*d_inner} @ {n_embd, n_seq_tokens, n_seqs} => {2*d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * xz = build_lora_mm(model.layers[il].ssm_in, cur);
        // split the above in two
        // => {d_inner, n_seq_tokens, n_seqs}
        ggml_tensor * x = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], 0);
        ggml_tensor * z = ggml_view_3d(ctx0, xz, d_inner, xz->ne[1], xz->ne[2], xz->nb[1], xz->nb[2], d_inner*ggml_element_size(xz));

        // conv
        {
            // => {d_conv - 1 + n_seq_tokens, d_inner, n_seqs}
            ggml_tensor * conv_x = ggml_concat(ctx0, conv, ggml_transpose(ctx0, x), 0);

            // copy last (d_conv - 1) columns back into the state cache
            ggml_tensor * last_conv = ggml_view_3d(ctx0, conv_x, d_conv - 1, d_inner, n_seqs, conv_x->nb[1], conv_x->nb[2], n_seq_tokens*(conv_x->nb[0]));

            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0, last_conv,
                    ggml_view_1d(ctx0, conv_states_all,
                        (d_conv - 1)*(d_inner)*(n_seqs),
                        kv_head*(d_conv - 1)*(d_inner)*ggml_element_size(conv_states_all))));

            // 1D convolution
            // The equivalent is to make a self-overlapping view of conv_x
            // over d_conv columns at each stride in the 3rd dimension,
            // then element-wise multiply that with the conv1d weight,
            // then sum the elements of each row,
            // (the last two steps are a dot product over rows (also doable with mul_mat))
            // then permute away the ne[0] dimension,
            // and then you're left with the resulting x tensor.
            // For simultaneous sequences, all sequences need to have the same length.
            x = ggml_ssm_conv(ctx0, conv_x, model.layers[il].ssm_conv1d);

            // bias
            x = ggml_add(ctx0, x, model.layers[il].ssm_conv1d_b);

            x = ggml_silu(ctx0, x);
        }

        // ssm
        {
            // {d_inner, dt_rank + 2*d_state} @ {d_inner, n_seq_tokens, n_seqs} => {dt_rank + 2*d_state, n_seq_tokens, n_seqs}
            ggml_tensor * x_db = build_lora_mm(model.layers[il].ssm_x, x);
            // split
            ggml_tensor * dt = ggml_view_3d(ctx0, x_db, dt_rank, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], 0);
            ggml_tensor * B  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*dt_rank);
            ggml_tensor * C  = ggml_view_3d(ctx0, x_db, d_state, n_seq_tokens, n_seqs, x_db->nb[1], x_db->nb[2], ggml_element_size(x_db)*(dt_rank+d_state));

            // Some Mamba variants (e.g. FalconMamba) apply RMS norm in B, C & Dt layers
            if (ssm_dt_b_c_rms) {
                dt = ggml_rms_norm(ctx0, dt, norm_rms_eps);
                B = ggml_rms_norm(ctx0, B, norm_rms_eps);
                C = ggml_rms_norm(ctx0, C, norm_rms_eps);
            }

            // {dt_rank, d_inner} @ {dt_rank, n_seq_tokens, n_seqs} => {d_inner, n_seq_tokens, n_seqs}
            dt = build_lora_mm(model.layers[il].ssm_dt, dt);
            dt = ggml_add(ctx0, dt, model.layers[il].ssm_dt_b);

            // Custom operator to optimize the parallel associative scan
            // as described in the Annex D of the Mamba paper.
            // => {d_inner, n_seq_tokens, n_seqs} and {d_state, d_inner, n_seqs}
            ggml_tensor * y_ssm = ggml_ssm_scan(ctx0, ssm, x, dt, model.layers[il].ssm_a, B, C);

            // store last states
            ggml_build_forward_expand(gf,
                ggml_cpy(ctx0,
                    ggml_view_1d(ctx0, y_ssm, d_state*d_inner*n_seqs, x->nb[3]),
                    ggml_view_1d(ctx0, ssm_states_all, d_state*d_inner*n_seqs, kv_head*d_state*d_inner*ggml_element_size(ssm_states_all))));

            ggml_tensor * y = ggml_view_3d(ctx0, y_ssm, d_inner, n_seq_tokens, n_seqs, x->nb[1], x->nb[2], 0);

            // TODO: skip computing output earlier for unused tokens

            // {d_inner, n_seq_tokens, n_seqs} * {d_inner} => {d_inner, n_seq_tokens, n_seqs}
            y = ggml_add(ctx0, y, ggml_mul(ctx0, x, model.layers[il].ssm_d));
            y = ggml_mul(ctx0, y, ggml_silu(ctx0, ggml_cont(ctx0, z)));

            // {d_inner, n_embd} @ {d_inner, n_seq_tokens, n_seqs} => {n_embd, n_seq_tokens, n_seqs}
            cur = build_lora_mm(model.layers[il].ssm_out, y);
        }

        // {n_embd, n_seq_tokens, n_seqs} => {n_embd, n_tokens}
        cur = ggml_reshape_2d(ctx0, cur, cur->ne[0], n_seq_tokens * n_seqs);
        //cb(cur, "mamba_out", il);

        return cur;
    }